

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branching.cpp
# Opt level: O2

void __thiscall
PriorityBranchGroup::PriorityBranchGroup
          (PriorityBranchGroup *this,vec<Branching_*> *_x,VarBranch vb)

{
  BranchGroup::BranchGroup(&this->super_BranchGroup,_x,vb,false);
  (this->super_BranchGroup).super_Branching._vptr_Branching = (_func_int **)&PTR_finished_001f3808;
  (this->annotations).sz = 0;
  (this->annotations).cap = 0;
  (this->annotations).data = (Branching **)0x0;
  return;
}

Assistant:

PriorityBranchGroup::PriorityBranchGroup(vec<Branching*>& _x, VarBranch vb) : BranchGroup(_x, vb) {}